

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update.c
# Opt level: O1

void gold_update(void)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  CHAR_DATA *ch;
  
  if (char_list != (CHAR_DATA *)0x0 && total_wealth != 0) {
    ch = char_list;
    do {
      bVar1 = is_npc(ch);
      if ((bVar1) && (ch->stolen_from == false)) {
        lVar3 = total_gold - player_gold;
        if (lVar3 < 0x186a1) {
          lVar3 = 100000;
        }
        lVar3 = (lVar3 / total_wealth) * (long)ch->pIndexData->wealth;
        if (9 < lVar3) {
          iVar2 = number_range((int)((double)lVar3 * 0.75),(int)((double)lVar3 * 1.25));
          lVar3 = (long)iVar2;
        }
        if (lVar3 < 1) {
          lVar3 = 0;
        }
        ch->gold = lVar3;
      }
      ch = ch->next;
    } while (ch != (CHAR_DATA *)0x0);
  }
  return;
}

Assistant:

void gold_update(void)
{
	CHAR_DATA *mob;
	long mob_gold;
	long gold;

	if (total_wealth == 0)
		return;

	for (mob = char_list; mob; mob = mob->next)
	{
		if (!is_npc(mob) || mob->stolen_from)
			continue;

		mob_gold = std::max(total_gold - player_gold, (long)100000);
		gold = mob->pIndexData->wealth * (mob_gold / total_wealth);

		if (gold > 9)
			gold = number_range((int)((float)gold * 0.75), (int)((float)gold * 1.25));

		if (gold < 0)
			gold = 0;

		mob->gold = gold;
	}
}